

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_encoder.cc
# Opt level: O2

void __thiscall
draco::MeshEdgebreakerEncoder::ComputeNumberOfEncodedPoints(MeshEdgebreakerEncoder *this)

{
  CornerIndex corner;
  MeshEdgebreakerEncoderImplInterface *pMVar1;
  pointer puVar2;
  pointer pIVar3;
  pointer pIVar4;
  bool bVar5;
  int iVar6;
  CornerIndex CVar7;
  CornerIndex corner_00;
  IndexType<unsigned_int,_draco::PointIndex_tag_type_> IVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Mesh *pMVar9;
  CornerIndex CVar10;
  pointer puVar11;
  long lVar12;
  int i;
  ulong uVar13;
  IndexType<unsigned_int,_draco::PointIndex_tag_type_> IVar14;
  size_t sVar15;
  long lVar16;
  MeshAttributeCornerTable *att_corner_table;
  vector<const_draco::MeshAttributeCornerTable_*,_std::allocator<const_draco::MeshAttributeCornerTable_*>_>
  attribute_corner_tables;
  CornerTable *this_00;
  
  pMVar1 = (this->impl_)._M_t.
           super___uniq_ptr_impl<draco::MeshEdgebreakerEncoderImplInterface,_std::default_delete<draco::MeshEdgebreakerEncoderImplInterface>_>
           ._M_t.
           super__Tuple_impl<0UL,_draco::MeshEdgebreakerEncoderImplInterface_*,_std::default_delete<draco::MeshEdgebreakerEncoderImplInterface>_>
           .super__Head_base<0UL,_draco::MeshEdgebreakerEncoderImplInterface_*,_false>._M_head_impl;
  if (pMVar1 != (MeshEdgebreakerEncoderImplInterface *)0x0) {
    iVar6 = (*pMVar1->_vptr_MeshEdgebreakerEncoderImplInterface[8])();
    this_00 = (CornerTable *)CONCAT44(extraout_var,iVar6);
    if (this_00 != (CornerTable *)0x0) {
      sVar15 = (long)(int)((ulong)((long)(this_00->vertex_corners_).vector_.
                                         super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this_00->vertex_corners_).vector_.
                                        super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 2) -
               (long)this_00->num_isolated_vertices_;
      pMVar9 = (this->super_MeshEncoder).mesh_;
      puVar11 = (pMVar9->super_PointCloud).attributes_.
                super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (1 < (int)((ulong)((long)puVar11 -
                           (long)(pMVar9->super_PointCloud).attributes_.
                                 super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3)) {
        attribute_corner_tables.
        super__Vector_base<const_draco::MeshAttributeCornerTable_*,_std::allocator<const_draco::MeshAttributeCornerTable_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        attribute_corner_tables.
        super__Vector_base<const_draco::MeshAttributeCornerTable_*,_std::allocator<const_draco::MeshAttributeCornerTable_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        attribute_corner_tables.
        super__Vector_base<const_draco::MeshAttributeCornerTable_*,_std::allocator<const_draco::MeshAttributeCornerTable_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        for (uVar13 = 0;
            puVar2 = (pMVar9->super_PointCloud).attributes_.
                     super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
            (long)uVar13 < (long)(int)((ulong)((long)puVar11 - (long)puVar2) >> 3);
            uVar13 = uVar13 + 1) {
          if (*(int *)((long)puVar2[uVar13]._M_t.
                             super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                             ._M_t + 0x38) != 0) {
            iVar6 = (*(this->super_MeshEncoder).super_PointCloudEncoder._vptr_PointCloudEncoder[0xe]
                    )(this,uVar13 & 0xffffffff);
            att_corner_table = (MeshAttributeCornerTable *)CONCAT44(extraout_var_00,iVar6);
            if (att_corner_table != (MeshAttributeCornerTable *)0x0) {
              std::
              vector<const_draco::MeshAttributeCornerTable_*,_std::allocator<const_draco::MeshAttributeCornerTable_*>_>
              ::push_back(&attribute_corner_tables,&att_corner_table);
            }
            pMVar9 = (this->super_MeshEncoder).mesh_;
            puVar11 = (pMVar9->super_PointCloud).attributes_.
                      super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          }
        }
        for (uVar13 = 0;
            pIVar3 = (this_00->vertex_corners_).vector_.
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
            uVar13 < ((ulong)((long)(this_00->vertex_corners_).vector_.
                                    super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar3) >> 2
                     & 0xffffffff); uVar13 = uVar13 + 1) {
          corner.value_ = pIVar3[uVar13].value_;
          if (corner.value_ != 0xffffffff) {
            IVar14.value_ = 0xffffffff;
            if (-1 < (int)corner.value_) {
              IVar14.value_ =
                   (((this->super_MeshEncoder).mesh_)->faces_).vector_.
                   super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[(ulong)corner.value_ / 3]._M_elems
                   [(ulong)corner.value_ % 3].value_;
            }
            CVar7 = CornerTable::SwingRight(this_00,corner);
            lVar16 = 0;
            CVar10.value_ = corner.value_;
            while (corner_00.value_ = CVar7.value_, corner_00.value_ != 0xffffffff) {
              IVar8.value_ = 0xffffffff;
              if (-1 < (int)corner_00.value_) {
                IVar8.value_ = (((this->super_MeshEncoder).mesh_)->faces_).vector_.
                               super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_start
                               [(ulong)corner_00.value_ / 3]._M_elems[(ulong)corner_00.value_ % 3].
                               value_;
              }
              if (IVar8.value_ == IVar14.value_) {
                lVar12 = 0;
                do {
                  if ((long)attribute_corner_tables.
                            super__Vector_base<const_draco::MeshAttributeCornerTable_*,_std::allocator<const_draco::MeshAttributeCornerTable_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)attribute_corner_tables.
                            super__Vector_base<const_draco::MeshAttributeCornerTable_*,_std::allocator<const_draco::MeshAttributeCornerTable_*>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3 == lVar12)
                  goto LAB_0013152d;
                  pIVar4 = (attribute_corner_tables.
                            super__Vector_base<const_draco::MeshAttributeCornerTable_*,_std::allocator<const_draco::MeshAttributeCornerTable_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar12]->corner_to_vertex_map_
                           ).
                           super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  lVar12 = lVar12 + 1;
                  IVar8.value_ = IVar14.value_;
                } while (pIVar4[corner_00.value_].value_ == pIVar4[CVar10.value_].value_);
              }
              lVar16 = lVar16 + 1;
              IVar14.value_ = IVar8.value_;
LAB_0013152d:
              if (corner_00.value_ == corner.value_) break;
              CVar7 = CornerTable::SwingRight(this_00,corner_00);
              CVar10.value_ = corner_00.value_;
            }
            bVar5 = CornerTable::IsOnBoundary(this_00,(VertexIndex)(uint)uVar13);
            sVar15 = (sVar15 + lVar16) - (ulong)(byte)(~bVar5 & lVar16 != 0);
          }
        }
        std::
        _Vector_base<const_draco::MeshAttributeCornerTable_*,_std::allocator<const_draco::MeshAttributeCornerTable_*>_>
        ::~_Vector_base(&attribute_corner_tables.
                         super__Vector_base<const_draco::MeshAttributeCornerTable_*,_std::allocator<const_draco::MeshAttributeCornerTable_*>_>
                       );
      }
      (this->super_MeshEncoder).super_PointCloudEncoder.num_encoded_points_ = sVar15;
    }
  }
  return;
}

Assistant:

void MeshEdgebreakerEncoder::ComputeNumberOfEncodedPoints() {
  if (!impl_) {
    return;
  }
  const CornerTable *const corner_table = impl_->GetCornerTable();
  if (!corner_table) {
    return;
  }
  size_t num_points =
      corner_table->num_vertices() - corner_table->NumIsolatedVertices();

  if (mesh()->num_attributes() > 1) {
    // Gather all corner tables for all non-position attributes.
    std::vector<const MeshAttributeCornerTable *> attribute_corner_tables;
    for (int i = 0; i < mesh()->num_attributes(); ++i) {
      if (mesh()->attribute(i)->attribute_type() ==
          GeometryAttribute::POSITION) {
        continue;
      }
      const MeshAttributeCornerTable *const att_corner_table =
          GetAttributeCornerTable(i);
      // Attribute corner table may not be used in some configurations. For
      // these cases we can assume the attribute connectivity to be the same as
      // the connectivity of the position data.
      if (att_corner_table) {
        attribute_corner_tables.push_back(att_corner_table);
      }
    }

    // Add a new point based on the configuration of interior attribute seams
    // (replicating what the decoder would do).
    for (VertexIndex vi(0); vi < corner_table->num_vertices(); ++vi) {
      if (corner_table->IsVertexIsolated(vi)) {
        continue;
      }
      // Go around all corners of the vertex and keep track of the observed
      // attribute seams.
      const CornerIndex first_corner_index = corner_table->LeftMostCorner(vi);
      const PointIndex first_point_index =
          mesh()->CornerToPointId(first_corner_index);

      PointIndex last_point_index = first_point_index;
      CornerIndex last_corner_index = first_corner_index;
      CornerIndex corner_index = corner_table->SwingRight(first_corner_index);
      size_t num_attribute_seams = 0;
      while (corner_index != kInvalidCornerIndex) {
        const PointIndex point_index = mesh()->CornerToPointId(corner_index);
        bool seam_found = false;
        if (point_index != last_point_index) {
          // Point index changed - new attribute seam detected.
          seam_found = true;
          last_point_index = point_index;
        } else {
          // Even though point indices matches, there still may be a seam caused
          // by non-manifold connectivity of non-position attribute data.
          for (int i = 0; i < attribute_corner_tables.size(); ++i) {
            if (attribute_corner_tables[i]->Vertex(corner_index) !=
                attribute_corner_tables[i]->Vertex(last_corner_index)) {
              seam_found = true;
              break;  // No need to process other attributes.
            }
          }
        }
        if (seam_found) {
          ++num_attribute_seams;
        }

        if (corner_index == first_corner_index) {
          break;
        }

        // Proceed to the next corner
        last_corner_index = corner_index;
        corner_index = corner_table->SwingRight(corner_index);
      }

      if (!corner_table->IsOnBoundary(vi) && num_attribute_seams > 0) {
        // If the last visited point index is the same as the first point index
        // we traveled all the way around the vertex. In this case the number of
        // new points should be num_attribute_seams - 1
        num_points += num_attribute_seams - 1;
      } else {
        // Else the vertex was either on a boundary (i.e. we couldn't travel all
        // around the vertex), or we ended up at a different point. In both of
        // these cases, the number of new points is equal to the number of
        // attribute seams.
        num_points += num_attribute_seams;
      }
    }
  }
  set_num_encoded_points(num_points);
}